

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractDOMParser::startEntityReference(AbstractDOMParser *this,XMLEntityDecl *entDecl)

{
  XMLCh *nam;
  int iVar1;
  undefined4 extraout_var;
  DOMEntityImpl *this_00;
  XMLCh *actualEncoding;
  DOMNode *pDVar2;
  DOMParentNode *pDVar3;
  
  nam = entDecl->fName;
  iVar1 = (*(this->fDocumentType->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0x29])();
  this_00 = (DOMEntityImpl *)
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x20))
                      ((long *)CONCAT44(extraout_var,iVar1),nam);
  if (this_00 != (DOMEntityImpl *)0x0) {
    actualEncoding = ReaderMgr::getCurrentEncodingStr(&this->fScanner->fReaderMgr);
    DOMEntityImpl::setInputEncoding(this_00,actualEncoding);
  }
  this->fCurrentEntity = this_00;
  if (this->fCreateEntityReferenceNodes == true) {
    pDVar2 = &DOMDocumentImpl::createEntityReferenceByParser(this->fDocument,nam)->super_DOMNode;
    (*((DOMNode *)&pDVar2->_vptr_DOMNode)->_vptr_DOMNode[0x2e])(pDVar2,0,1);
    pDVar3 = castToParentImpl(this->fCurrentParent);
    (**pDVar3->_vptr_DOMParentNode)(pDVar3,pDVar2);
    this->fCurrentParent = pDVar2;
    this->fCurrentNode = pDVar2;
    if (this_00 != (DOMEntityImpl *)0x0) {
      (*(this_00->super_DOMEntity).super_DOMNode._vptr_DOMNode[0x35])(this_00,pDVar2);
      return;
    }
  }
  return;
}

Assistant:

void AbstractDOMParser::startEntityReference(const XMLEntityDecl& entDecl)
{
    const XMLCh * entName = entDecl.getName();
    DOMNamedNodeMap *entities = fDocumentType->getEntities();
    DOMEntityImpl* entity = (DOMEntityImpl*)entities->getNamedItem(entName);
    if (entity)
        entity->setInputEncoding(fScanner->getReaderMgr()->getCurrentEncodingStr());
    fCurrentEntity = entity;


    // Following line has been moved up so that erImpl is only declared
    // and used if create entity ref flag is true
    if (fCreateEntityReferenceNodes == true)    {
        DOMEntityReference *er = fDocument->createEntityReferenceByParser(entName);

        //set the readOnly flag to false before appending node, will be reset
        // in endEntityReference
        DOMEntityReferenceImpl *erImpl = (DOMEntityReferenceImpl *) er;
        erImpl->setReadOnly(false, true);

        castToParentImpl (fCurrentParent)->appendChildFast (er);

        fCurrentParent = er;
        fCurrentNode = er;

    // this entityRef needs to be stored in Entity map too.
    // We'd decide later whether the entity nodes should be created by a
    // separated method in parser or not. For now just stick it in if
    // the ref nodes are created
        if (entity)
            entity->setEntityRef(er);
    }
}